

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Measurements::BestCase::BestCase(BestCase *this,int argc,char **argv)

{
  int iVar1;
  double local_80;
  double local_78;
  int local_70;
  uint local_6c;
  undefined8 uStack_68;
  uint i_1;
  double local_60;
  unique_ptr<Implementation2,_std::default_delete<Implementation2>_> local_58;
  int local_4c;
  unique_ptr<Implementation1,_std::default_delete<Implementation1>_> local_48;
  uint local_3c;
  undefined8 uStack_38;
  uint i;
  unsigned_long size;
  char **local_20;
  char **argv_local;
  BestCase *pBStack_10;
  int argc_local;
  BestCase *this_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pBStack_10 = this;
  BenchmarkBase<Measurements::BestCase>::BenchmarkBase
            (&this->super_BenchmarkBase<Measurements::BestCase>,argc,argv);
  (this->super_BenchmarkBase<Measurements::BestCase>).super_Benchmark._vptr_Benchmark =
       (_func_int **)&PTR_run_00143d10;
  poly::
  vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  ::vector(&this->pv);
  std::
  vector<std::unique_ptr<Interface,_std::default_delete<Interface>_>,_std::allocator<std::unique_ptr<Interface,_std::default_delete<Interface>_>_>_>
  ::vector(&this->sv);
  uStack_38 = 0x10;
  if (((this->super_BenchmarkBase<Measurements::BestCase>).is_standard & 1U) == 0) {
    for (local_6c = 0; local_6c < (this->super_BenchmarkBase<Measurements::BestCase>).num_objs;
        local_6c = local_6c + 1) {
      iVar1 = rand();
      if (iVar1 % 2 == 0) {
        local_78 = 1.1;
        local_80 = 1.3;
        poly::
        vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
        ::emplace_back<Implementation2,double,double>
                  ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
                    *)&this->pv,&local_78,&local_80);
      }
      else {
        local_70 = rand();
        poly::
        vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
        ::emplace_back<Implementation1,int>
                  ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
                    *)&this->pv,&local_70);
      }
    }
  }
  else {
    for (local_3c = 0; local_3c < (this->super_BenchmarkBase<Measurements::BestCase>).num_objs;
        local_3c = local_3c + 1) {
      iVar1 = rand();
      if (iVar1 % 2 == 0) {
        local_60 = 1.1;
        uStack_68 = 0x3ff4cccccccccccd;
        std::make_unique<Implementation2,double,double>((double *)&local_58,&local_60);
        std::
        vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
        ::emplace_back<std::unique_ptr<Implementation2,std::default_delete<Implementation2>>>
                  ((vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
                    *)&this->sv,&local_58);
        std::unique_ptr<Implementation2,_std::default_delete<Implementation2>_>::~unique_ptr
                  (&local_58);
      }
      else {
        local_4c = rand();
        std::make_unique<Implementation1,int>((int *)&local_48);
        std::
        vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
        ::emplace_back<std::unique_ptr<Implementation1,std::default_delete<Implementation1>>>
                  ((vector<std::unique_ptr<Interface,std::default_delete<Interface>>,std::allocator<std::unique_ptr<Interface,std::default_delete<Interface>>>>
                    *)&this->sv,&local_48);
        std::unique_ptr<Implementation1,_std::default_delete<Implementation1>_>::~unique_ptr
                  (&local_48);
      }
    }
  }
  return;
}

Assistant:

BestCase(int argc, char* argv[])
        : BenchmarkBase(argc, argv)
    {
        constexpr auto size = std::max(sizeof(Implementation1), sizeof(Implementation2));

        if (is_standard) {
            for (auto i = 0U; i < num_objs; ++i) {
                if (std::rand() % 2) {
                    sv.emplace_back(std::make_unique<Implementation1>(std::rand()));
                } else {
                    sv.emplace_back(std::make_unique<Implementation2>(1.1, 1.3));
                }
            }
        } else {
            for (auto i = 0U; i < num_objs; ++i) {
                static_assert(page_size > size, "this should not happen...");
                if (std::rand() % 2) {
                    pv.emplace_back<Implementation1>(std::rand());
                } else {
                    pv.emplace_back<Implementation2>(1.1, 1.3);
                }
            }
        }
    }